

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteDatabase::Cleanup(SQLiteDatabase *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  Logger *pLVar4;
  char *args;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  undefined8 local_d8 [2];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_WalletDatabase)._vptr_WalletDatabase[8])();
  args = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp";
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,(AnnotatedMixin<std::mutex> *)g_sqlite_mutex,"g_sqlite_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
             ,0xb5,false);
  g_sqlite_count = g_sqlite_count + -1;
  if (g_sqlite_count == 0) {
    iVar3 = sqlite3_shutdown();
    if (iVar3 != 0) {
      local_d8[0] = sqlite3_errstr(iVar3);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char_const*>
                  (&local_58,(tinyformat *)"SQLiteDatabase: Failed to shutdown SQLite: %s\n",
                   (char *)local_d8,(char **)args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pLVar4 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x5a;
        local_58._M_string_length = 0x6fecdb;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
        ;
        source_file._M_len = 0x5a;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "Cleanup";
        logging_function._M_len = 7;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xb9,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Cleanup() noexcept
{
    AssertLockNotHeld(g_sqlite_mutex);

    Close();

    LOCK(g_sqlite_mutex);
    if (--g_sqlite_count == 0) {
        int ret = sqlite3_shutdown();
        if (ret != SQLITE_OK) {
            LogPrintf("SQLiteDatabase: Failed to shutdown SQLite: %s\n", sqlite3_errstr(ret));
        }
    }
}